

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

image<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator=
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          image<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  uint uVar4;
  
  if (this == other) {
    return this;
  }
  if ((other->m_pixel_buf).m_size == 0) {
    uVar4 = other->m_height * other->m_pitch;
    if ((uVar4 == 0) || (other->m_pPixels == (color_quad<unsigned_char,_int> *)0x0)) {
      vector<crnlib::color_quad<unsigned_char,_int>_>::clear(&this->m_pixel_buf);
      pcVar3 = (color_quad<unsigned_char,_int> *)0x0;
      goto LAB_00107eb9;
    }
    vector<crnlib::color_quad<unsigned_char,_int>_>::resize(&this->m_pixel_buf,uVar4,false);
    vector<crnlib::color_quad<unsigned_char,_int>_>::insert
              (&this->m_pixel_buf,0,other->m_pPixels,(this->m_pixel_buf).m_size);
  }
  else {
    vector<crnlib::color_quad<unsigned_char,_int>_>::operator=
              (&this->m_pixel_buf,&other->m_pixel_buf);
  }
  pcVar3 = (this->m_pixel_buf).m_p;
LAB_00107eb9:
  this->m_pPixels = pcVar3;
  uVar4 = other->m_height;
  uVar1 = other->m_pitch;
  uVar2 = other->m_total;
  this->m_width = other->m_width;
  this->m_height = uVar4;
  this->m_pitch = uVar1;
  this->m_total = uVar2;
  this->m_comp_flags = other->m_comp_flags;
  return this;
}

Assistant:

image& operator=(const image& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (other.m_pixel_buf.empty())
            {
                // This doesn't look very safe - let's make a new instance.
                //m_pixel_buf.clear();
                //m_pPixels = other.m_pPixels;

                const uint total_pixels = other.m_pitch * other.m_height;
                if ((total_pixels) && (other.m_pPixels))
                {
                    m_pixel_buf.resize(total_pixels);
                    m_pixel_buf.insert(0, other.m_pPixels, m_pixel_buf.size());
                    m_pPixels = &m_pixel_buf.front();
                }
                else
                {
                    m_pixel_buf.clear();
                    m_pPixels = nullptr;
                }
            }
            else
            {
                m_pixel_buf = other.m_pixel_buf;
                m_pPixels = &m_pixel_buf.front();
            }

            m_width = other.m_width;
            m_height = other.m_height;
            m_pitch = other.m_pitch;
            m_total = other.m_total;
            m_comp_flags = other.m_comp_flags;

            return *this;
        }